

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.h
# Opt level: O3

void __thiscall Acceptor<Client>::Acceptor(Acceptor<Client> *this,int port)

{
  int iVar1;
  undefined8 *puVar2;
  int opt;
  undefined4 local_a4;
  uint *local_a0;
  undefined8 local_98;
  uint local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  uint *local_80;
  undefined8 local_78;
  uint local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  uint *local_60;
  undefined8 local_58;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  uint *local_40;
  undefined8 local_38;
  uint local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  (this->super_IAcceptor<Client>)._vptr_IAcceptor = (_func_int **)&PTR_accept_0010ca08;
  local_a4 = 1;
  this->addrlen = 0x10;
  iVar1 = socket(2,1,0);
  this->server_fd = iVar1;
  if (iVar1 == 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Socket create","");
    *puVar2 = &PTR__AcceptException_0010ca70;
    puVar2[1] = puVar2 + 3;
    if (local_40 == &local_30) {
      *(uint *)(puVar2 + 3) = local_30;
      *(undefined4 *)((long)puVar2 + 0x1c) = uStack_2c;
      *(undefined4 *)(puVar2 + 4) = uStack_28;
      *(undefined4 *)((long)puVar2 + 0x24) = uStack_24;
    }
    else {
      puVar2[1] = local_40;
      puVar2[3] = CONCAT44(uStack_2c,local_30);
    }
    puVar2[2] = local_38;
    local_38 = 0;
    local_30 = local_30 & 0xffffff00;
    local_40 = &local_30;
    __cxa_throw(puVar2,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  iVar1 = setsockopt(iVar1,1,2,&local_a4,4);
  if (iVar1 != 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Set sock opt","");
    *puVar2 = &PTR__AcceptException_0010ca70;
    puVar2[1] = puVar2 + 3;
    if (local_60 == &local_50) {
      *(uint *)(puVar2 + 3) = local_50;
      *(undefined4 *)((long)puVar2 + 0x1c) = uStack_4c;
      *(undefined4 *)(puVar2 + 4) = uStack_48;
      *(undefined4 *)((long)puVar2 + 0x24) = uStack_44;
    }
    else {
      puVar2[1] = local_60;
      puVar2[3] = CONCAT44(uStack_4c,local_50);
    }
    puVar2[2] = local_58;
    local_58 = 0;
    local_50 = local_50 & 0xffffff00;
    local_60 = &local_50;
    __cxa_throw(puVar2,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  (this->address).sin_family = 2;
  (this->address).sin_addr.s_addr = 0;
  (this->address).sin_port = (ushort)port << 8 | (ushort)port >> 8;
  iVar1 = bind(this->server_fd,(sockaddr *)&this->address,0x10);
  if (iVar1 < 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_80 = &local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Bind failed","");
    *puVar2 = &PTR__AcceptException_0010ca70;
    puVar2[1] = puVar2 + 3;
    if (local_80 == &local_70) {
      *(uint *)(puVar2 + 3) = local_70;
      *(undefined4 *)((long)puVar2 + 0x1c) = uStack_6c;
      *(undefined4 *)(puVar2 + 4) = uStack_68;
      *(undefined4 *)((long)puVar2 + 0x24) = uStack_64;
    }
    else {
      puVar2[1] = local_80;
      puVar2[3] = CONCAT44(uStack_6c,local_70);
    }
    puVar2[2] = local_78;
    local_78 = 0;
    local_70 = local_70 & 0xffffff00;
    local_80 = &local_70;
    __cxa_throw(puVar2,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  iVar1 = listen(this->server_fd,3);
  if (-1 < iVar1) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Listen","");
  *puVar2 = &PTR__AcceptException_0010ca70;
  puVar2[1] = puVar2 + 3;
  if (local_a0 == &local_90) {
    *(uint *)(puVar2 + 3) = local_90;
    *(undefined4 *)((long)puVar2 + 0x1c) = uStack_8c;
    *(undefined4 *)(puVar2 + 4) = uStack_88;
    *(undefined4 *)((long)puVar2 + 0x24) = uStack_84;
  }
  else {
    puVar2[1] = local_a0;
    puVar2[3] = CONCAT44(uStack_8c,local_90);
  }
  puVar2[2] = local_98;
  local_98 = 0;
  local_90 = local_90 & 0xffffff00;
  local_a0 = &local_90;
  __cxa_throw(puVar2,&AcceptException::typeinfo,AcceptException::~AcceptException);
}

Assistant:

Acceptor<T>::Acceptor(int port) {
    int opt = 1; 
    addrlen = sizeof(address); 
       
    if ((server_fd = socket(AF_INET, SOCK_STREAM, 0)) == 0) { 
        throw AcceptException("Socket create");
    } 
    if (setsockopt(server_fd, SOL_SOCKET, SO_REUSEADDR, 
                                                  &opt, sizeof(opt))) { 
        throw AcceptException("Set sock opt");
    } 

    address.sin_family = AF_INET; 
    address.sin_addr.s_addr = INADDR_ANY; 
    address.sin_port = htons(port);

    if (bind(server_fd, (struct sockaddr *)&address,  
                                 sizeof(address))<0) { 
        throw AcceptException("Bind failed");
    } 
    if (listen(server_fd, 3) < 0) { 
        throw AcceptException("Listen");
    }  
}